

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSat3.c
# Opt level: O0

sat_solver3 * Gia_ManSat3Create(Gia_Man_t *p)

{
  Cnf_Dat_t *pCnf_00;
  undefined4 local_30;
  int status;
  sat_solver3 *pSat;
  Cnf_Dat_t *pCnf;
  Gia_Man_t *p_local;
  
  pCnf_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,1,0,0);
  p_local = (Gia_Man_t *)Gia_ManSat3Init(pCnf_00);
  if (p_local == (Gia_Man_t *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = sat_solver3_simplify((sat_solver3 *)p_local);
  }
  Cnf_DataFree(pCnf_00);
  if (local_30 == 0) {
    if (p_local != (Gia_Man_t *)0x0) {
      sat_solver3_delete((sat_solver3 *)p_local);
    }
    p_local = (Gia_Man_t *)0x0;
  }
  return (sat_solver3 *)p_local;
}

Assistant:

sat_solver3 * Gia_ManSat3Create( Gia_Man_t * p )
{
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 1, 0, 0 );
    sat_solver3 * pSat = Gia_ManSat3Init( pCnf );
    int status = pSat ? sat_solver3_simplify(pSat) : 0;
    Cnf_DataFree( pCnf );
    if ( status )
        return pSat;
    if ( pSat )
        sat_solver3_delete( pSat );
    return NULL;
}